

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O2

void __thiscall
spvtools::opt::StructuredCFGAnalysis::StructuredCFGAnalysis
          (StructuredCFGAnalysis *this,IRContext *ctx)

{
  _Head_base<0UL,_spvtools::opt::Module_*,_false> _Var1;
  pointer puVar2;
  bool bVar3;
  FeatureManager *pFVar4;
  pointer puVar5;
  
  this->context_ = ctx;
  (this->bb_to_construct_)._M_h._M_buckets = &(this->bb_to_construct_)._M_h._M_single_bucket;
  (this->bb_to_construct_)._M_h._M_bucket_count = 1;
  (this->bb_to_construct_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_to_construct_)._M_h._M_element_count = 0;
  (this->bb_to_construct_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_to_construct_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_to_construct_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  utils::BitVector::BitVector(&this->merge_blocks_,0x400);
  pFVar4 = IRContext::get_feature_mgr(this->context_);
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,Shader);
  if (bVar3) {
    _Var1._M_head_impl =
         (this->context_->module_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
         _M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->functions_ + 8);
    for (puVar5 = *(pointer *)
                   &((_Var1._M_head_impl)->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
        ; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      AddBlocksInFunction(this,(Function *)puVar5->_M_t);
    }
  }
  return;
}

Assistant:

StructuredCFGAnalysis::StructuredCFGAnalysis(IRContext* ctx) : context_(ctx) {
  // If this is not a shader, there are no merge instructions, and not
  // structured CFG to analyze.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return;
  }

  for (auto& func : *context_->module()) {
    AddBlocksInFunction(&func);
  }
}